

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

void free(void *__ptr)

{
  malloc_tree_chunk *pmVar1;
  long lVar2;
  char *pcVar3;
  malloc_tree_chunk **ppmVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  malloc_tree_chunk *pmVar9;
  byte bVar10;
  uint uVar11;
  tbinptr pmVar12;
  tbinptr pmVar13;
  tbinptr pmVar14;
  uint uVar15;
  long lVar16;
  tbinptr pmVar17;
  mstate m;
  tbinptr pmVar18;
  malloc_tree_chunk **ppmVar19;
  size_t __len;
  
  iVar5 = _gm_.mutex;
  if (__ptr == (void *)0x0) {
    return;
  }
  pmVar14 = (tbinptr)((long)__ptr - 0x10);
  if (((byte)_gm_.mflags & 2) != 0) {
    uVar15 = 1;
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if (iVar5 != 0) {
      while (_gm_.mutex != 0) {
        if ((uVar15 & 0x3f) == 0) {
          sched_yield();
        }
        uVar15 = uVar15 + 1;
      }
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
    }
  }
  if ((pmVar14 < _gm_.least_addr) || (uVar7 = *(ulong *)((long)__ptr + -8), ((uint)uVar7 & 3) == 1))
  goto LAB_00107565;
  sVar6 = uVar7 & 0xfffffffffffffff8;
  pmVar13 = (tbinptr)((long)&pmVar14->prev_foot + sVar6);
  if ((uVar7 & 1) != 0) goto LAB_001070cb;
  uVar8 = pmVar14->prev_foot;
  if ((uVar7 & 2) == 0) {
    __len = sVar6 + uVar8 + 0x20;
    iVar5 = munmap((void *)((long)pmVar14 - uVar8),__len);
    sVar6 = _gm_.dvsize;
    if (iVar5 == 0) {
      _gm_.footprint = _gm_.footprint - __len;
    }
    goto LAB_0010753d;
  }
  pmVar14 = (tbinptr)((long)pmVar14 - uVar8);
  if (pmVar14 < _gm_.least_addr) goto LAB_00107565;
  sVar6 = sVar6 + uVar8;
  if (pmVar14 == (tbinptr)_gm_.dv) {
    if ((~(uint)pmVar13->head & 3) == 0) {
      _gm_.dvsize = sVar6;
      pmVar13->head = pmVar13->head & 0xfffffffffffffffe;
      pmVar14->head = sVar6 | 1;
      pmVar13->prev_foot = sVar6;
      sVar6 = _gm_.dvsize;
      goto LAB_0010753d;
    }
  }
  else if (uVar8 < 0x100) {
    pmVar9 = pmVar14->fd;
    pmVar1 = pmVar14->bk;
    if ((pmVar9 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar8 >> 3) * 2)) &&
       ((pmVar9 < _gm_.least_addr || (pmVar9->bk != pmVar14)))) goto LAB_00107565;
    if (pmVar1 == pmVar9) {
      bVar10 = (byte)(uVar8 >> 3) & 0x1f;
      _gm_.smallmap = _gm_.smallmap & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
    }
    else {
      if ((pmVar1 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar8 >> 3) * 2)) &&
         ((pmVar1 < _gm_.least_addr || (pmVar1->fd != pmVar14)))) goto LAB_00107565;
      pmVar9->bk = pmVar1;
      pmVar1->fd = pmVar9;
    }
  }
  else {
    pmVar17 = pmVar14->bk;
    pmVar9 = pmVar14->child[2];
    if (pmVar17 == pmVar14) {
      if (pmVar14->child[1] == (tbinptr)0x0) {
        if (pmVar14->child[0] == (tbinptr)0x0) {
          pmVar17 = (tbinptr)0x0;
          goto LAB_00107028;
        }
        pmVar12 = pmVar14->child[0];
        ppmVar4 = pmVar14->child;
      }
      else {
        pmVar12 = pmVar14->child[1];
        ppmVar4 = pmVar14->child + 1;
      }
      do {
        do {
          ppmVar19 = ppmVar4;
          pmVar17 = pmVar12;
          pmVar12 = pmVar17->child[1];
          ppmVar4 = pmVar17->child + 1;
        } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
        pmVar12 = pmVar17->child[0];
        ppmVar4 = pmVar17->child;
      } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
      if (ppmVar19 < _gm_.least_addr) goto LAB_00107565;
      *ppmVar19 = (malloc_tree_chunk *)0x0;
    }
    else {
      pmVar1 = pmVar14->fd;
      if (((pmVar1 < _gm_.least_addr) || (pmVar1->bk != pmVar14)) || (pmVar17->fd != pmVar14))
      goto LAB_00107565;
      pmVar1->bk = pmVar17;
      pmVar17->fd = pmVar1;
    }
LAB_00107028:
    if (pmVar9 != (malloc_tree_chunk *)0x0) {
      uVar15 = *(uint *)(pmVar14->child + 3);
      if (pmVar14 == _gm_.treebins[uVar15]) {
        _gm_.treebins[uVar15] = pmVar17;
        if (pmVar17 == (tbinptr)0x0) {
          bVar10 = (byte)uVar15 & 0x1f;
          _gm_.treemap = _gm_.treemap & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
        }
        else {
LAB_00107074:
          pcVar3 = _gm_.least_addr;
          if (pmVar17 < _gm_.least_addr) goto LAB_00107565;
          pmVar17->child[2] = pmVar9;
          pmVar9 = pmVar14->child[0];
          if (pmVar9 != (malloc_tree_chunk *)0x0) {
            if (pmVar9 < pcVar3) goto LAB_00107565;
            pmVar17->child[0] = pmVar9;
            pmVar9->parent = pmVar17;
          }
          pmVar9 = pmVar14->child[1];
          if (pmVar9 != (malloc_tree_chunk *)0x0) {
            if (pmVar9 < pcVar3) goto LAB_00107565;
            pmVar17->child[1] = pmVar9;
            pmVar9->parent = pmVar17;
          }
        }
      }
      else {
        if (pmVar9 < _gm_.least_addr) goto LAB_00107565;
        pmVar9->child[pmVar9->child[0] != pmVar14] = pmVar17;
        if (pmVar17 != (tbinptr)0x0) goto LAB_00107074;
      }
    }
  }
LAB_001070cb:
  if ((pmVar13 <= pmVar14) || (uVar7 = pmVar13->head, (uVar7 & 1) == 0)) goto LAB_00107565;
  if ((uVar7 & 2) == 0) {
    if (pmVar13 == (tbinptr)_gm_.top) {
      uVar8 = sVar6 + _gm_.topsize;
      _gm_.topsize = uVar8;
      _gm_.top = (mchunkptr)pmVar14;
      pmVar14->head = uVar8 | 1;
      if (pmVar14 == (tbinptr)_gm_.dv) {
        _gm_.dv = (mchunkptr)0x0;
        _gm_.dvsize = 0;
      }
      sVar6 = _gm_.dvsize;
      if (_gm_.trim_check < uVar8) {
        sys_trim((mstate)0x0,uVar7);
        sVar6 = _gm_.dvsize;
      }
      goto LAB_0010753d;
    }
    if (pmVar13 == (tbinptr)_gm_.dv) {
      uVar7 = sVar6 + _gm_.dvsize;
      _gm_.dvsize = uVar7;
      _gm_.dv = (mchunkptr)pmVar14;
      pmVar14->head = uVar7 | 1;
      *(ulong *)((long)&pmVar14->prev_foot + uVar7) = uVar7;
      sVar6 = _gm_.dvsize;
      goto LAB_0010753d;
    }
    if (uVar7 < 0x100) {
      pmVar9 = pmVar13->fd;
      pmVar1 = pmVar13->bk;
      if ((pmVar9 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar7 >> 3) * 2)) &&
         ((pmVar9 < _gm_.least_addr || (pmVar9->bk != pmVar13)))) goto LAB_00107565;
      if (pmVar1 == pmVar9) {
        bVar10 = (byte)(uVar7 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
      }
      else {
        if ((pmVar1 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar7 >> 3) * 2)) &&
           ((pmVar1 < _gm_.least_addr || (pmVar1->fd != pmVar13)))) goto LAB_00107565;
        pmVar9->bk = pmVar1;
        pmVar1->fd = pmVar9;
      }
    }
    else {
      pmVar17 = pmVar13->bk;
      pmVar9 = pmVar13->child[2];
      if (pmVar17 == pmVar13) {
        if (pmVar13->child[1] == (tbinptr)0x0) {
          if (pmVar13->child[0] == (tbinptr)0x0) {
            pmVar17 = (tbinptr)0x0;
            goto LAB_00107478;
          }
          pmVar12 = pmVar13->child[0];
          ppmVar4 = pmVar13->child;
        }
        else {
          pmVar12 = pmVar13->child[1];
          ppmVar4 = pmVar13->child + 1;
        }
        do {
          do {
            ppmVar19 = ppmVar4;
            pmVar17 = pmVar12;
            pmVar12 = pmVar17->child[1];
            ppmVar4 = pmVar17->child + 1;
          } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
          pmVar12 = pmVar17->child[0];
          ppmVar4 = pmVar17->child;
        } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar19 < _gm_.least_addr) goto LAB_00107565;
        *ppmVar19 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar1 = pmVar13->fd;
        if (((pmVar1 < _gm_.least_addr) || (pmVar1->bk != pmVar13)) || (pmVar17->fd != pmVar13))
        goto LAB_00107565;
        pmVar1->bk = pmVar17;
        pmVar17->fd = pmVar1;
      }
LAB_00107478:
      if (pmVar9 != (malloc_tree_chunk *)0x0) {
        uVar15 = *(uint *)(pmVar13->child + 3);
        if (pmVar13 == _gm_.treebins[uVar15]) {
          _gm_.treebins[uVar15] = pmVar17;
          if (pmVar17 == (tbinptr)0x0) {
            bVar10 = (byte)uVar15 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
          }
          else {
LAB_001074c4:
            pcVar3 = _gm_.least_addr;
            if (pmVar17 < _gm_.least_addr) goto LAB_00107565;
            pmVar17->child[2] = pmVar9;
            pmVar9 = pmVar13->child[0];
            if (pmVar9 != (malloc_tree_chunk *)0x0) {
              if (pmVar9 < pcVar3) goto LAB_00107565;
              pmVar17->child[0] = pmVar9;
              pmVar9->parent = pmVar17;
            }
            pmVar9 = pmVar13->child[1];
            if (pmVar9 != (malloc_tree_chunk *)0x0) {
              if (pmVar9 < pcVar3) goto LAB_00107565;
              pmVar17->child[1] = pmVar9;
              pmVar9->parent = pmVar17;
            }
          }
        }
        else {
          if (pmVar9 < _gm_.least_addr) goto LAB_00107565;
          pmVar9->child[pmVar9->child[0] != pmVar13] = pmVar17;
          if (pmVar17 != (tbinptr)0x0) goto LAB_001074c4;
        }
      }
    }
    sVar6 = sVar6 + (uVar7 & 0xfffffffffffffff8);
    pmVar14->head = sVar6 | 1;
    *(size_t *)((long)&pmVar14->prev_foot + sVar6) = sVar6;
    if (pmVar14 == (tbinptr)_gm_.dv) goto LAB_0010753d;
  }
  else {
    pmVar13->head = uVar7 & 0xfffffffffffffffe;
    pmVar14->head = sVar6 | 1;
    *(size_t *)((long)&pmVar14->prev_foot + sVar6) = sVar6;
  }
  if (sVar6 < 0x100) {
    uVar7 = sVar6 >> 3;
    if ((_gm_.smallmap >> ((uint)uVar7 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar7 & 0x1f);
      pmVar9 = (malloc_tree_chunk *)(_gm_.smallbins + uVar7 * 2);
    }
    else {
      pmVar9 = (malloc_tree_chunk *)_gm_.smallbins[uVar7 * 2 + 2];
      if ((malloc_tree_chunk *)_gm_.smallbins[uVar7 * 2 + 2] < _gm_.least_addr) {
LAB_00107565:
        abort();
      }
    }
    _gm_.smallbins[uVar7 * 2 + 2] = (mchunkptr)pmVar14;
    pmVar9->bk = pmVar14;
    pmVar14->fd = pmVar9;
    pmVar14->bk = (malloc_tree_chunk *)(_gm_.smallbins + uVar7 * 2);
    sVar6 = _gm_.dvsize;
  }
  else {
    uVar15 = (uint)(sVar6 >> 8);
    if (uVar15 == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0x1f;
      if (uVar15 < 0x10000) {
        uVar11 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar11 = (uint)((sVar6 >> ((ulong)(byte)(0x26 - (char)(uVar11 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar11 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar13 = (tbinptr)(_gm_.treebins + uVar11);
    *(uint *)(pmVar14->child + 3) = uVar11;
    pmVar14->child[0] = (malloc_tree_chunk *)0x0;
    pmVar14->child[1] = (malloc_tree_chunk *)0x0;
    if ((_gm_.treemap >> (uVar11 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar11 & 0x1f);
      pmVar17 = pmVar13;
    }
    else {
      bVar10 = 0x39 - (char)(uVar11 >> 1);
      if (uVar11 == 0x1f) {
        bVar10 = 0;
      }
      lVar16 = sVar6 << (bVar10 & 0x3f);
      pmVar13 = (tbinptr)pmVar13->prev_foot;
      do {
        pmVar12 = pmVar13;
        if ((pmVar12->head & 0xfffffffffffffff8) == sVar6) {
          if ((pmVar12 < _gm_.least_addr) || (pmVar17 = pmVar12->fd, pmVar17 < _gm_.least_addr))
          goto LAB_00107565;
          pmVar13 = (tbinptr)&pmVar12->fd;
          pmVar17->bk = pmVar14;
          lVar16 = 0x30;
          m = (mstate)&DAT_00000010;
          pmVar18 = (tbinptr)0x0;
          goto LAB_001073b0;
        }
        lVar2 = lVar16 >> 0x3f;
        lVar16 = lVar16 * 2;
        pmVar13 = *(tbinptr *)((long)pmVar12 + lVar2 * -8 + 0x20);
      } while (pmVar13 != (tbinptr)0x0);
      pmVar13 = (tbinptr)((long)pmVar12 + lVar2 * -8 + 0x20);
      pmVar17 = pmVar12;
      if (pmVar13 < _gm_.least_addr) goto LAB_00107565;
    }
    m = (mstate)&DAT_00000030;
    lVar16 = 0x10;
    pmVar12 = pmVar14;
    pmVar18 = pmVar14;
LAB_001073b0:
    pmVar13->prev_foot = (size_t)pmVar14;
    *(tbinptr *)((long)m->smallbins + (long)(pmVar14[-2].child + 3)) = pmVar17;
    pmVar14->bk = pmVar12;
    *(tbinptr *)((long)&pmVar14->prev_foot + lVar16) = pmVar18;
    _gm_.release_checks = _gm_.release_checks - 1;
    sVar6 = _gm_.dvsize;
    if (_gm_.release_checks == 0) {
      release_unused_segments(m);
      sVar6 = _gm_.dvsize;
    }
  }
LAB_0010753d:
  _gm_.dvsize = sVar6;
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return;
}

Assistant:

void dlfree(void* mem) {
  /*
     Consolidate freed chunks with preceeding or succeeding bordering
     free chunks, if they exist, and then place in a bin.  Intermixed
     with special cases for top, dv, mmapped chunks, and usage errors.
  */

  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
#else /* FOOTERS */
#define fm gm
#endif /* FOOTERS */
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
#if !FOOTERS
#undef fm
#endif /* FOOTERS */
}